

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stddev.hpp
# Opt level: O1

void duckdb::STDDevBaseOperation::
     ConstantOperation<double,duckdb::StddevState,duckdb::STDDevPopOperation>
               (StddevState *state,double *input,AggregateUnaryInput *unary_input,idx_t count)

{
  double dVar1;
  uint64_t uVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  
  if (count != 0) {
    uVar2 = state->count;
    do {
      uVar2 = uVar2 + 1;
      dVar1 = *input;
      dVar3 = dVar1 - state->mean;
      auVar5._8_4_ = (int)(uVar2 >> 0x20);
      auVar5._0_8_ = uVar2;
      auVar5._12_4_ = 0x45300000;
      dVar4 = dVar3 / ((auVar5._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) + state->mean;
      state->mean = dVar4;
      state->dsquared = (dVar1 - dVar4) * dVar3 + state->dsquared;
      count = count - 1;
    } while (count != 0);
    state->count = uVar2;
  }
  return;
}

Assistant:

static void ConstantOperation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input,
	                              idx_t count) {
		for (idx_t i = 0; i < count; i++) {
			Operation<INPUT_TYPE, STATE, OP>(state, input, unary_input);
		}
	}